

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamProgramChain.cpp
# Opt level: O0

void __thiscall BamTools::SamProgramChain::Add(SamProgramChain *this,SamProgram *program)

{
  bool bVar1;
  long in_RSI;
  value_type *in_RDI;
  SamProgram *in_stack_ffffffffffffffa8;
  SamProgramChain *in_stack_ffffffffffffffb0;
  string *psVar2;
  vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_> *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffd0;
  SamProgramChain *in_stack_ffffffffffffffd8;
  
  bVar1 = Contains(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (!bVar1) {
    bVar1 = IsEmpty((SamProgramChain *)0x18e764);
    if (!bVar1) {
      psVar2 = (string *)&stack0xffffffffffffffd0;
      NextIdFor(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      std::__cxx11::string::operator=((string *)(in_RSI + 0xb8),psVar2);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
    }
    std::vector<BamTools::SamProgram,_std::allocator<BamTools::SamProgram>_>::push_back
              (in_stack_ffffffffffffffc0,in_RDI);
  }
  return;
}

Assistant:

void SamProgramChain::Add(SamProgram& program)
{

    // ignore duplicated records
    if (Contains(program)) {
        return;
    }

    // if other programs already in chain, try to find the "next" record
    // tries to match another record's PPID with @program's ID
    if (!IsEmpty()) {
        program.NextProgramID = NextIdFor(program.ID);
    }

    // store program record
    m_data.push_back(program);
}